

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

void __thiscall
nuraft::inmem_log_store::write_at(inmem_log_store *this,ulong index,ptr<log_entry> *entry)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  long lVar6;
  mapped_type *pmVar7;
  iterator __position;
  const_iterator __position_00;
  ptr<log_entry> clone;
  _Base_ptr local_50;
  ptr<log_entry> local_48;
  key_type local_38;
  
  local_50 = (_Base_ptr)index;
  make_clone(&local_48);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  p_Var1 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position_00._M_node = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(_Base_ptr *)(p_Var4 + 1) < local_50]) {
    if (*(_Base_ptr *)(p_Var4 + 1) >= local_50) {
      __position_00._M_node = p_Var4;
    }
  }
  while ((_Rb_tree_header *)__position_00._M_node != p_Var1) {
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
    ::_M_erase_aux(&(this->logs_)._M_t,__position_00);
    __position_00._M_node = p_Var4;
  }
  pmVar5 = std::
           map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
           ::operator[](&this->logs_,(key_type *)&local_50);
  (pmVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,
             &local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  if ((this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i != 0) {
    lVar6 = std::chrono::_V2::system_clock::now();
    p_Var2 = local_50;
    local_38 = (this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i * 1000 + lVar6 / 1000
    ;
    pmVar7 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->disk_emul_logs_being_written_,&local_38);
    *pmVar7 = (mapped_type)p_Var2;
    __position._M_node =
         (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)__position._M_node !=
           &(this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header) {
      if (local_50 < __position._M_node[1]._M_parent) {
        __position = std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                                         *)&this->disk_emul_logs_being_written_,__position);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
    EventAwaiter::invoke(&this->disk_emul_ea_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
  if (local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void inmem_log_store::write_at(ulong index, ptr<log_entry>& entry) {
    ptr<log_entry> clone = make_clone(entry);

    // Discard all logs equal to or greater than `index.
    std::lock_guard<std::mutex> l(logs_lock_);
    auto itr = logs_.lower_bound(index);
    while (itr != logs_.end()) {
        itr = logs_.erase(itr);
    }
    logs_[index] = clone;

    if (disk_emul_delay) {
        uint64_t cur_time = timer_helper::get_timeofday_us();
        disk_emul_logs_being_written_[cur_time + disk_emul_delay * 1000] = index;

        // Remove entries greater than `index`.
        auto entry = disk_emul_logs_being_written_.begin();
        while (entry != disk_emul_logs_being_written_.end()) {
            if (entry->second > index) {
                entry = disk_emul_logs_being_written_.erase(entry);
            } else {
                entry++;
            }
        }
        disk_emul_ea_.invoke();
    }
}